

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical_cast.h
# Opt level: O0

Time * Fixpp::details::LexicalCast<Fixpp::Type::UTCTimestamp>::cast
                 (Time *__return_storage_ptr__,char *offset,size_t size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  runtime_error *prVar6;
  time_t time;
  _Storage<int,_true> a_Stack_f8 [2];
  tm tm;
  int local_b8;
  _Optional_payload_base<int> local_b4;
  _Optional_payload_base<int> local_ac;
  optional<int> usec;
  _Optional_payload_base<int> local_98;
  optional<int> msec;
  int sec;
  int min;
  int hour;
  int day;
  int month;
  int year;
  anon_class_8_1_50ba0494 parseFragment;
  StreamCursor local_60;
  StreamCursor cursor;
  RawStreamBuf<char> buf;
  size_t size_local;
  char *offset_local;
  
  RawStreamBuf<char>::RawStreamBuf((RawStreamBuf<char> *)&cursor,offset,size);
  StreamCursor::StreamCursor(&local_60,(StreamBuf<char> *)&cursor,0);
  _month = &local_60;
  iVar2 = cast::anon_class_8_1_50ba0494::operator()
                    ((anon_class_8_1_50ba0494 *)&month,4,"Could not parse year from UTCTimestamp");
  iVar3 = cast::anon_class_8_1_50ba0494::operator()
                    ((anon_class_8_1_50ba0494 *)&month,2,"Could not parse month from UTCTimestamp");
  iVar4 = cast::anon_class_8_1_50ba0494::operator()
                    ((anon_class_8_1_50ba0494 *)&month,2,"Could not parse month from UTCTimestamp");
  bVar1 = StreamCursor::advance(&local_60,1);
  if (!bVar1) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar6,"Could not parse hour from UTCTimestamp, expected \'-\' got EOF");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar5 = cast::anon_class_8_1_50ba0494::operator()
                    ((anon_class_8_1_50ba0494 *)&month,2,"Could not parse hours from UTCTimestamp");
  bVar1 = StreamCursor::advance(&local_60,1);
  if (!bVar1) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar6,"Could not parse minutes from UTCTimestamp, expected \':\' got EOF");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  msec.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._4_4_ =
       cast::anon_class_8_1_50ba0494::operator()
                 ((anon_class_8_1_50ba0494 *)&month,2,"Could not parse minutes from UTCTimestamp");
  bVar1 = StreamCursor::advance(&local_60,1);
  if (!bVar1) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar6,"Could not parse seconds from UTCTimestamp, expected \':\' got EOF");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  msec.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._M_payload
  ._M_value = cast::anon_class_8_1_50ba0494::operator()
                        ((anon_class_8_1_50ba0494 *)&month,2,
                         "Could not parse seconds from UTCTimestamp");
  std::optional<int>::optional((optional<int> *)&local_98);
  bVar1 = StreamCursor::eof(&local_60);
  if (!bVar1) {
    StreamCursor::advance(&local_60,1);
    usec.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
    _M_payload._M_value =
         cast::anon_class_8_1_50ba0494::operator()
                   ((anon_class_8_1_50ba0494 *)&month,3,
                    "Could not parse milliseconds from UTCTimestamp");
    std::optional<int>::optional<int,_true>
              ((optional<int> *)
               &usec.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int>._M_engaged,(int *)&usec);
    local_98 = stack0xffffffffffffff60;
  }
  std::optional<int>::optional((optional<int> *)&local_ac);
  bVar1 = StreamCursor::eof(&local_60);
  if (!bVar1) {
    local_b8 = cast::anon_class_8_1_50ba0494::operator()
                         ((anon_class_8_1_50ba0494 *)&month,3,
                          "Could not parse microseconds from UTCTimeOnly");
    std::optional<int>::optional<int,_true>((optional<int> *)&local_b4,&local_b8);
    local_ac = local_b4;
  }
  tm.tm_wday = 0;
  tm.tm_yday = 0;
  tm.tm_isdst = 0;
  tm._36_4_ = 0;
  tm.tm_mon = 0;
  tm.tm_year = 0;
  tm.tm_gmtoff = 0;
  tm.tm_mday = iVar2 + -0x76c;
  tm.tm_hour = iVar3 + -1;
  tm.tm_min = iVar4;
  tm.tm_sec = iVar5;
  a_Stack_f8[1] =
       (_Storage<int,_true>)
       msec.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._4_4_
  ;
  a_Stack_f8[0]._M_value =
       msec.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
       _M_payload._M_value;
  time = mkgmtime((tm *)a_Stack_f8);
  Type::UTCTimestamp::Time::Time
            (__return_storage_ptr__,time,(optional<int>)local_98,(optional<int>)local_ac);
  RawStreamBuf<char>::~RawStreamBuf((RawStreamBuf<char> *)&cursor);
  return __return_storage_ptr__;
}

Assistant:

static Type::UTCTimestamp::Time cast(const char* offset, size_t size)
            {
                RawStreamBuf<> buf(const_cast<char *>(offset), size);
                StreamCursor cursor(&buf);

                const auto parseFragment = [&](size_t size, const char* error)
                {
                    int value;
                    if (!match_int_fast_n(&value, cursor, size))
                        throw std::runtime_error(error);
                    return value;
                };

                const int year  = parseFragment(4, "Could not parse year from UTCTimestamp");
                const int month = parseFragment(2, "Could not parse month from UTCTimestamp");
                const int day   = parseFragment(2, "Could not parse month from UTCTimestamp");

                // Literal('-')
                if (!cursor.advance(1))
                    throw std::runtime_error("Could not parse hour from UTCTimestamp, expected '-' got EOF");

                const int hour = parseFragment(2, "Could not parse hours from UTCTimestamp");
                //
                // Literal(':')
                if (!cursor.advance(1))
                    throw std::runtime_error("Could not parse minutes from UTCTimestamp, expected ':' got EOF");

                const int min = parseFragment(2, "Could not parse minutes from UTCTimestamp");
                //
                // Literal(':')
                if (!cursor.advance(1))
                    throw std::runtime_error("Could not parse seconds from UTCTimestamp, expected ':' got EOF");

                const int sec = parseFragment(2, "Could not parse seconds from UTCTimestamp");

                std::optional<int> msec;
                if (!cursor.eof())
                {
                    // Literal('.')
                    cursor.advance(1);
                    msec = parseFragment(3, "Could not parse milliseconds from UTCTimestamp");
                }

                std::optional<int> usec;
                if (!cursor.eof())
                {
                    usec = parseFragment(3, "Could not parse microseconds from UTCTimeOnly");
                }

                std::tm tm{};
                // tm_year is year since 1900
                tm.tm_year = year - 1900;
                // tm_mon is 0-indexed
                tm.tm_mon = month - 1;
                tm.tm_mday = day;
                tm.tm_hour = hour;
                tm.tm_min = min;
                tm.tm_sec = sec;

                return {mkgmtime(&tm), msec, usec};
            }